

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O1

int quicly_decode_ack_frame(uint8_t **src,uint8_t *end,quicly_ack_frame_t *frame,int is_ack_ecn)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  byte *pbVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  pbVar6 = *src;
  uVar4 = 0xffffffffffffffff;
  if (pbVar6 != end) {
    if (*pbVar6 < 0x40) {
      *src = pbVar6 + 1;
      uVar4 = (ulong)*pbVar6;
    }
    else {
      uVar7 = 1L << (*pbVar6 >> 6);
      if (uVar7 <= (ulong)((long)end - (long)pbVar6) && -1 < (long)end - (long)pbVar6) {
        *src = pbVar6 + 1;
        uVar4 = (ulong)(*pbVar6 & 0x3f);
        lVar2 = uVar7 - 1;
        pbVar6 = pbVar6 + 2;
        do {
          *src = pbVar6;
          uVar4 = uVar4 << 8 | (ulong)pbVar6[-1];
          pbVar6 = pbVar6 + 1;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
    }
  }
  frame->largest_acknowledged = uVar4;
  if (uVar4 != 0xffffffffffffffff) {
    pbVar6 = *src;
    uVar7 = 0xffffffffffffffff;
    if (pbVar6 != end) {
      if (*pbVar6 < 0x40) {
        *src = pbVar6 + 1;
        uVar7 = (ulong)*pbVar6;
      }
      else {
        uVar3 = 1L << (*pbVar6 >> 6);
        if (uVar3 <= (ulong)((long)end - (long)pbVar6) && -1 < (long)end - (long)pbVar6) {
          *src = pbVar6 + 1;
          uVar7 = (ulong)(*pbVar6 & 0x3f);
          lVar2 = uVar3 - 1;
          pbVar6 = pbVar6 + 2;
          do {
            *src = pbVar6;
            uVar7 = uVar7 << 8 | (ulong)pbVar6[-1];
            pbVar6 = pbVar6 + 1;
            lVar2 = lVar2 + -1;
          } while (lVar2 != 0);
        }
      }
    }
    frame->ack_delay = uVar7;
    if (uVar7 != 0xffffffffffffffff) {
      pbVar6 = *src;
      uVar7 = 0xffffffffffffffff;
      if (pbVar6 != end) {
        if (*pbVar6 < 0x40) {
          *src = pbVar6 + 1;
          uVar7 = (ulong)*pbVar6;
        }
        else {
          uVar3 = 1L << (*pbVar6 >> 6);
          if (uVar3 <= (ulong)((long)end - (long)pbVar6) && -1 < (long)end - (long)pbVar6) {
            *src = pbVar6 + 1;
            uVar7 = (ulong)(*pbVar6 & 0x3f);
            lVar2 = uVar3 - 1;
            pbVar6 = pbVar6 + 2;
            do {
              *src = pbVar6;
              uVar7 = uVar7 << 8 | (ulong)pbVar6[-1];
              pbVar6 = pbVar6 + 1;
              lVar2 = lVar2 + -1;
            } while (lVar2 != 0);
          }
        }
      }
      frame->num_gaps = uVar7;
      if (uVar7 != 0xffffffffffffffff) {
        pbVar6 = *src;
        uVar7 = 0xffffffffffffffff;
        if (pbVar6 != end) {
          if (*pbVar6 < 0x40) {
            *src = pbVar6 + 1;
            uVar7 = (ulong)*pbVar6;
          }
          else {
            uVar3 = 1L << (*pbVar6 >> 6);
            if (uVar3 <= (ulong)((long)end - (long)pbVar6) && -1 < (long)end - (long)pbVar6) {
              *src = pbVar6 + 1;
              uVar7 = (ulong)(*pbVar6 & 0x3f);
              lVar2 = uVar3 - 1;
              pbVar6 = pbVar6 + 2;
              do {
                *src = pbVar6;
                uVar7 = uVar7 << 8 | (ulong)pbVar6[-1];
                pbVar6 = pbVar6 + 1;
                lVar2 = lVar2 + -1;
              } while (lVar2 != 0);
            }
          }
        }
        if ((uVar7 != 0xffffffffffffffff) && (uVar7 <= uVar4)) {
          frame->smallest_acknowledged = uVar4 - uVar7;
          frame->ack_block_lengths[0] = uVar7 + 1;
          if (frame->num_gaps != 0) {
            pbVar6 = *src;
            uVar5 = 0;
            do {
              uVar4 = 0xffffffffffffffff;
              if (pbVar6 != end) {
                if (*pbVar6 < 0x40) {
                  *src = pbVar6 + 1;
                  uVar4 = (ulong)*pbVar6;
                  pbVar6 = pbVar6 + 1;
                }
                else {
                  uVar7 = 1L << (*pbVar6 >> 6);
                  if (uVar7 <= (ulong)((long)end - (long)pbVar6) && -1 < (long)end - (long)pbVar6) {
                    *src = pbVar6 + 1;
                    uVar4 = (ulong)(*pbVar6 & 0x3f);
                    lVar2 = uVar7 - 1;
                    pbVar1 = pbVar6 + 1;
                    do {
                      pbVar6 = pbVar1 + 1;
                      *src = pbVar6;
                      uVar4 = uVar4 << 8 | (ulong)*pbVar1;
                      lVar2 = lVar2 + -1;
                      pbVar1 = pbVar6;
                    } while (lVar2 != 0);
                  }
                }
              }
              if (uVar4 == 0xffffffffffffffff) {
                return 7;
              }
              frame->gaps[uVar5] = uVar4 + 1;
              if (frame->smallest_acknowledged <= uVar4) {
                return 7;
              }
              uVar4 = frame->smallest_acknowledged - (uVar4 + 1);
              frame->smallest_acknowledged = uVar4;
              uVar7 = 0xffffffffffffffff;
              if (pbVar6 != end) {
                if (*pbVar6 < 0x40) {
                  *src = pbVar6 + 1;
                  uVar7 = (ulong)*pbVar6;
                  pbVar6 = pbVar6 + 1;
                }
                else {
                  uVar3 = 1L << (*pbVar6 >> 6);
                  if (uVar3 <= (ulong)((long)end - (long)pbVar6) && -1 < (long)end - (long)pbVar6) {
                    *src = pbVar6 + 1;
                    uVar7 = (ulong)(*pbVar6 & 0x3f);
                    lVar2 = uVar3 - 1;
                    pbVar1 = pbVar6 + 1;
                    do {
                      pbVar6 = pbVar1 + 1;
                      *src = pbVar6;
                      uVar7 = uVar7 << 8 | (ulong)*pbVar1;
                      lVar2 = lVar2 + -1;
                      pbVar1 = pbVar6;
                    } while (lVar2 != 0);
                  }
                }
              }
              if (uVar7 == 0xffffffffffffffff) {
                return 7;
              }
              if (uVar4 <= uVar7) {
                return 7;
              }
              frame->ack_block_lengths[uVar5 + 1] = uVar7 + 1;
              frame->smallest_acknowledged = frame->smallest_acknowledged - (uVar7 + 1);
              uVar5 = uVar5 + 1;
            } while (uVar5 != frame->num_gaps);
          }
          if (is_ack_ecn == 0) {
            return 0;
          }
          pbVar6 = *src;
          lVar2 = 0;
          while( true ) {
            bVar9 = true;
            if (pbVar6 != end) {
              if (*pbVar6 < 0x40) {
                pbVar6 = pbVar6 + 1;
                *src = pbVar6;
                bVar9 = false;
              }
              else {
                uVar4 = 1L << (*pbVar6 >> 6);
                bVar9 = true;
                if (uVar4 <= (ulong)((long)end - (long)pbVar6) && -1 < (long)end - (long)pbVar6) {
                  *src = pbVar6 + 1;
                  uVar7 = (ulong)(*pbVar6 & 0x3f);
                  lVar8 = uVar4 - 1;
                  pbVar1 = pbVar6 + 1;
                  do {
                    pbVar6 = pbVar1 + 1;
                    *src = pbVar6;
                    uVar7 = (ulong)*pbVar1 | uVar7 << 8;
                    lVar8 = lVar8 + -1;
                    pbVar1 = pbVar6;
                  } while (lVar8 != 0);
                  bVar9 = uVar7 == 0xffffffffffffffff;
                }
              }
            }
            if (bVar9) break;
            lVar2 = lVar2 + 1;
            if (lVar2 == 3) {
              return 0;
            }
          }
        }
      }
    }
  }
  return 7;
}

Assistant:

int quicly_decode_ack_frame(const uint8_t **src, const uint8_t *end, quicly_ack_frame_t *frame, int is_ack_ecn)
{
    uint64_t i, tmp;

    if ((frame->largest_acknowledged = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->ack_delay = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->num_gaps = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;

    if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if (frame->largest_acknowledged < tmp)
        goto Error;
    frame->smallest_acknowledged = frame->largest_acknowledged - tmp;
    frame->ack_block_lengths[0] = tmp + 1;

    for (i = 0; i != frame->num_gaps; ++i) {
        if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        frame->gaps[i] = tmp + 1;
        if (frame->smallest_acknowledged < frame->gaps[i])
            goto Error;
        frame->smallest_acknowledged -= frame->gaps[i];
        if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        tmp += 1;
        if (frame->smallest_acknowledged < tmp)
            goto Error;
        frame->ack_block_lengths[i + 1] = tmp;
        frame->smallest_acknowledged -= tmp;
    }

    if (is_ack_ecn) {
        /* just skip ECT(0), ECT(1), ECT-CE counters for the time being */
        for (i = 0; i != 3; ++i)
            if (quicly_decodev(src, end) == UINT64_MAX)
                goto Error;
    }
    return 0;
Error:
    return QUICLY_ERROR_FRAME_ENCODING;
}